

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::Instance>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Resources *this;
  RefData<vk::VkInstance_s_*> data;
  allocator<char> local_d9;
  string local_d8;
  Move<vk::VkInstance_s_*> local_a8;
  RefData<vk::VkInstance_s_*> local_90;
  undefined1 local_78 [8];
  Unique<vk::VkInstance_s_*> obj;
  undefined1 local_58 [7];
  Resources res;
  Environment env;
  Context *context_local;
  TestStatus *local_10;
  
  local_10 = __return_storage_ptr__;
  Environment::Environment((Environment *)local_58,context,1);
  this = (Resources *)((long)&obj.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator + 7);
  Instance::Resources::Resources
            (this,(Environment *)local_58,(Parameters *)((long)&context_local + 7));
  Instance::create(&local_a8,(Environment *)local_58,this,(Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_90,(Move *)&local_a8);
  data.deleter.m_destroyInstance = local_90.deleter.m_destroyInstance;
  data.object = local_90.object;
  data.deleter.m_allocator = local_90.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::Unique((Unique<vk::VkInstance_s_*> *)local_78,data);
  ::vk::refdetails::Move<vk::VkInstance_s_*>::~Move(&local_a8);
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::~Unique((Unique<vk::VkInstance_s_*> *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Ok",&local_d9);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}